

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

void __thiscall sector_t::SetSpecial(sector_t *this,secspecial_t *spec)

{
  int iVar1;
  short sVar2;
  
  this->special = spec->special;
  iVar1 = spec->damageamount;
  this->damagetype = (FName)(spec->damagetype).super_FName;
  this->damageamount = iVar1;
  sVar2 = spec->leakydamage;
  this->damageinterval = spec->damageinterval;
  this->leakydamage = sVar2;
  this->Flags = spec->Flags & 0x7b0U | this->Flags & 0xfffff84f;
  return;
}

Assistant:

void sector_t::SetSpecial(const secspecial_t *spec)
{
	special = spec->special;
	damageamount = spec->damageamount;
	damagetype = spec->damagetype;
	damageinterval = spec->damageinterval;
	leakydamage = spec->leakydamage;
	Flags = (Flags & ~SECF_SPECIALFLAGS) | (spec->Flags & SECF_SPECIALFLAGS);
}